

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForFreeVarAndNonBindingRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForFreeVarAndNonBindingRow_Test *this)

{
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<fizplex::DVector> __l;
  LP *in_RDI;
  double in_stack_fffffffffffffe98;
  double in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  ColType in_stack_fffffffffffffeac;
  LP *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  LP *in_stack_fffffffffffffec0;
  undefined8 **ppuVar1;
  allocator_type *in_stack_fffffffffffffec8;
  undefined8 **ppuVar2;
  LP *in_stack_fffffffffffffed0;
  RowType in_stack_fffffffffffffedc;
  iterator pDVar3;
  pointer local_f0;
  pointer local_e8;
  pointer vecs;
  undefined1 feasible;
  LPTestFeasibility *this_00;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 *local_80;
  undefined1 *local_78 [3];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  undefined8 *local_30;
  undefined8 local_28;
  
  LP::add_column(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98,9.22551982247401e-318);
  LP::add_row(in_RDI,in_stack_fffffffffffffedc,(double)in_stack_fffffffffffffed0,
              (double)in_stack_fffffffffffffec8);
  LP::add_value(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                (size_t)in_stack_fffffffffffffeb0,
                (double)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  LP::add_logicals(in_stack_fffffffffffffed0);
  local_80 = local_78;
  local_a0 = 0;
  local_98 = 0;
  local_90 = &local_a0;
  local_88 = 2;
  l._M_len = (size_type)in_stack_fffffffffffffec0;
  l._M_array = in_stack_fffffffffffffeb8;
  DVector::DVector((DVector *)in_stack_fffffffffffffeb0,l);
  local_80 = (undefined8 *)local_60;
  this_00 = (LPTestFeasibility *)0xc014000000000000;
  l_00._M_len = (size_type)in_stack_fffffffffffffec0;
  l_00._M_array = in_stack_fffffffffffffeb8;
  DVector::DVector((DVector *)in_stack_fffffffffffffeb0,l_00);
  local_80 = (undefined8 *)local_48;
  local_f0 = (pointer)0x4014000000000000;
  local_e8 = (pointer)0xc014000000000000;
  vecs = (pointer)&local_f0;
  feasible = 0;
  l_01._M_len = (size_type)in_stack_fffffffffffffec0;
  l_01._M_array = in_stack_fffffffffffffeb8;
  DVector::DVector((DVector *)in_stack_fffffffffffffeb0,l_01);
  local_30 = local_78;
  local_28 = 3;
  pDVar3 = (iterator)&stack0xffffffffffffff0f;
  std::allocator<fizplex::DVector>::allocator((allocator<fizplex::DVector> *)0x1c7f8d);
  __l._M_len = (size_type)in_RDI;
  __l._M_array = pDVar3;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffed0,__l,in_stack_fffffffffffffec8);
  LPTestFeasibility::check_feasible
            (this_00,(bool)feasible,
             (vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)vecs);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffeb0);
  std::allocator<fizplex::DVector>::~allocator((allocator<fizplex::DVector> *)0x1c7fe1);
  ppuVar2 = (undefined8 **)local_78;
  ppuVar1 = &local_30;
  do {
    ppuVar1 = ppuVar1 + -3;
    DVector::~DVector((DVector *)0x1c800a);
  } while (ppuVar1 != ppuVar2);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForFreeVarAndNonBindingRow) {
  lp.add_column(ColType::Free, -inf, inf);
  lp.add_row(RowType::NonBinding, -inf, inf);
  lp.add_value(0, 0, 1.0);
  lp.add_logicals();

  check_feasible(true, {{0, 0}, {-5, 5}, {5, -5}});
}